

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  int *piVar1;
  char cVar2;
  ImGuiContext *pIVar3;
  char *__dest;
  char *pcVar4;
  undefined1 *puVar5;
  void *pvVar6;
  ImGuiSettingsHandler *pIVar7;
  char *pcVar8;
  char *pcVar9;
  ImGuiContext *ctx;
  char *pcVar10;
  char *pcVar11;
  
  pIVar3 = GImGui;
  if (ini_size == 0) {
    ini_size = strlen(ini_data);
  }
  if (pIVar3 != (ImGuiContext *)0x0) {
    piVar1 = &(pIVar3->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  __dest = (char *)(*GImAllocatorAllocFunc)(ini_size + 1,GImAllocatorUserData);
  memcpy(__dest,ini_data,ini_size);
  __dest[ini_size] = '\0';
  if (0 < (long)ini_size) {
    pcVar11 = __dest + ini_size;
    pvVar6 = (void *)0x0;
    pIVar7 = (ImGuiSettingsHandler *)0x0;
    pcVar10 = __dest;
    do {
      pcVar4 = pcVar10 + 2;
      pcVar8 = pcVar10;
      while( true ) {
        pcVar8 = pcVar8 + 1;
        cVar2 = *pcVar10;
        if ((cVar2 != '\n') && (cVar2 != '\r')) break;
        pcVar10 = pcVar10 + 1;
        pcVar4 = pcVar4 + 1;
      }
      pcVar9 = pcVar10;
      if (pcVar10 < pcVar11) {
        while ((cVar2 != '\n' && (cVar2 != '\r'))) {
          pcVar9 = pcVar8;
          if (pcVar11 <= pcVar8) goto LAB_0012d7a2;
          cVar2 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        }
        pcVar9 = pcVar8 + -1;
      }
LAB_0012d7a2:
      *pcVar9 = '\0';
      if (*pcVar10 != ';') {
        if (((*pcVar10 == '[') && (pcVar10 < pcVar9)) && (pcVar9[-1] == ']')) {
          pcVar9[-1] = '\0';
          pcVar10 = pcVar10 + 1;
          puVar5 = (undefined1 *)memchr(pcVar10,0x5d,(long)pcVar9 - (long)pcVar4);
          if ((puVar5 == (undefined1 *)0x0) ||
             (pvVar6 = memchr(puVar5 + 1,0x5b,(size_t)(pcVar9 + (-1 - (long)(puVar5 + 1)))),
             pvVar6 == (void *)0x0)) {
            pcVar4 = "Window";
          }
          else {
            *puVar5 = 0;
            pcVar4 = pcVar10;
            pcVar10 = (char *)((long)pvVar6 + 1);
          }
          pIVar7 = FindSettingsHandler(pcVar4);
          if (pIVar7 == (ImGuiSettingsHandler *)0x0) {
            pIVar7 = (ImGuiSettingsHandler *)0x0;
            pvVar6 = (void *)0x0;
          }
          else {
            pvVar6 = (*pIVar7->ReadOpenFn)(pIVar3,pIVar7,pcVar10);
          }
        }
        else if ((pIVar7 != (ImGuiSettingsHandler *)0x0) && (pvVar6 != (void *)0x0)) {
          (*pIVar7->ReadLineFn)(pIVar3,pIVar7,pvVar6,pcVar10);
        }
      }
      pcVar10 = pcVar9 + 1;
    } while (pcVar10 < pcVar11);
    if (__dest == (char *)0x0) goto LAB_0012d87d;
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + -1;
  }
LAB_0012d87d:
  (*GImAllocatorFreeFunc)(__dest,GImAllocatorUserData);
  pIVar3->SettingsLoaded = true;
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    char* buf = (char*)ImGui::MemAlloc(ini_size + 1);
    char* buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf[ini_size] = 0;

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(intptr_t)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
            {
                name_start = type_start; // Import legacy entries that have no type
                type_start = "Window";
            }
            else
            {
                *type_end = 0; // Overwrite first ']'
                name_start++;  // Skip second '['
            }
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    ImGui::MemFree(buf);
    g.SettingsLoaded = true;
}